

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O0

Gia_Man_t * Gia_ManExtractWin(Gia_Man_t *p,Vec_Int_t *vOuts,int fPoOnly)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int local_4c;
  Gia_Obj_t *pGStack_48;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vAnds;
  Vec_Int_t *vPos;
  Vec_Int_t *vPis;
  Vec_Int_t *pVStack_18;
  int fPoOnly_local;
  Vec_Int_t *vOuts_local;
  Gia_Man_t *p_local;
  
  vPis._4_4_ = fPoOnly;
  pVStack_18 = vOuts;
  vOuts_local = (Vec_Int_t *)p;
  Gia_ManPrepareWin(p,vOuts,&vPos,&vAnds,(Vec_Int_t **)&pNew,fPoOnly);
  iVar2 = Vec_IntSize(vPos);
  iVar3 = Vec_IntSize(vAnds);
  iVar4 = Vec_IntSize((Vec_Int_t *)pNew);
  p_00 = Gia_ManStart(iVar2 + iVar3 + iVar4 + 1);
  pcVar6 = Abc_UtilStrsav(*(char **)vOuts_local);
  p_00->pName = pcVar6;
  pGVar7 = Gia_ManConst0((Gia_Man_t *)vOuts_local);
  pGVar7->Value = 0;
  local_4c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vPos);
    pVVar1 = vOuts_local;
    bVar8 = false;
    if (local_4c < iVar2) {
      iVar2 = Vec_IntEntry(vPos,local_4c);
      pGStack_48 = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
      bVar8 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    uVar5 = Gia_ManAppendCi(p_00);
    pGStack_48->Value = uVar5;
    local_4c = local_4c + 1;
  }
  local_4c = 0;
  while( true ) {
    iVar2 = Vec_IntSize((Vec_Int_t *)pNew);
    pVVar1 = vOuts_local;
    bVar8 = false;
    if (local_4c < iVar2) {
      iVar2 = Vec_IntEntry((Vec_Int_t *)pNew,local_4c);
      pGStack_48 = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
      bVar8 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar2 = Gia_ObjFanin0Copy(pGStack_48);
    iVar3 = Gia_ObjFanin1Copy(pGStack_48);
    uVar5 = Gia_ManAppendAnd(p_00,iVar2,iVar3);
    pGStack_48->Value = uVar5;
    local_4c = local_4c + 1;
  }
  local_4c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vAnds);
    pVVar1 = vOuts_local;
    bVar8 = false;
    if (local_4c < iVar2) {
      iVar2 = Vec_IntEntry(vAnds,local_4c);
      pGStack_48 = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
      bVar8 = pGStack_48 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    Gia_ManAppendCo(p_00,pGStack_48->Value);
    local_4c = local_4c + 1;
  }
  Vec_IntFree(vPos);
  Vec_IntFree(vAnds);
  Vec_IntFree((Vec_Int_t *)pNew);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManExtractWin( Gia_Man_t * p, Vec_Int_t * vOuts, int fPoOnly )
{
    Vec_Int_t * vPis, * vPos, * vAnds;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManPrepareWin( p, vOuts, &vPis, &vPos, &vAnds, fPoOnly );
    // create AIG
    pNew = Gia_ManStart( Vec_IntSize(vPis) + Vec_IntSize(vPos) + Vec_IntSize(vAnds) + 1 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObjVec( vPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachObjVec( vPos, p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vAnds );
    return pNew;
}